

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

float __thiscall notch::core::HingeLoss::output(HingeLoss *this,Array *actual,Array *expected)

{
  float fVar1;
  float fVar2;
  float fVar3;
  size_t sVar4;
  float *pfVar5;
  float local_24;
  float p;
  float loss;
  Array *expected_local;
  Array *actual_local;
  HingeLoss *this_local;
  
  sVar4 = std::valarray<float>::size(actual);
  if (sVar4 != 1) {
    __assert_fail("1 == actual.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x812,"virtual float notch::HingeLoss::output(const Array &, const Array &)");
  }
  sVar4 = std::valarray<float>::size(expected);
  if (sVar4 == 1) {
    pfVar5 = std::valarray<float>::operator[](actual,0);
    fVar1 = *pfVar5;
    pfVar5 = std::valarray<float>::operator[](expected,0);
    fVar2 = *pfVar5;
    if (fVar1 * fVar2 < 1.0) {
      pfVar5 = std::valarray<float>::operator[](expected,0);
      fVar3 = *pfVar5;
      pfVar5 = std::valarray<float>::operator[](&this->lossGrad,0);
      *pfVar5 = -fVar3;
      local_24 = 1.0 - fVar1 * fVar2;
    }
    else {
      pfVar5 = std::valarray<float>::operator[](&this->lossGrad,0);
      *pfVar5 = 0.0;
      local_24 = 0.0;
    }
    return local_24;
  }
  __assert_fail("1 == expected.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x813,"virtual float notch::HingeLoss::output(const Array &, const Array &)");
}

Assistant:

virtual float output(const Array &actual, const Array &expected) {
        assert (1 == actual.size());
        assert (1 == expected.size());
        float loss;
        float p = actual[0]*expected[0];
        if (p >= 1.0) {
            lossGrad[0] = 0.0;
            loss = 0.0;
        } else {
            lossGrad[0] = - expected[0];
            loss = 1 - p;
        }
        return loss;
    }